

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O1

void predict_or_learn<true>(LRQstate *lrq,single_learner *base,example *ec)

{
  size_t *__s;
  features *this;
  size_t i;
  float fVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  vw *pvVar5;
  byte *pbVar6;
  long lVar7;
  vw *pvVar8;
  element_type *peVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  weight *pwVar13;
  ostream *poVar14;
  char *pcVar15;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  _Rb_tree_node_base *p_Var16;
  uint32_t *puVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong uVar20;
  v_array<unsigned_char> *__range1;
  bool bVar21;
  float fVar22;
  float fVar23;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  uint local_2b4;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  float local_294;
  size_t local_288;
  ulong local_278;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  element_type local_230;
  uint64_t *local_1f0;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  char *local_1c8;
  char *local_1c0;
  size_t local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pvVar5 = lrq->all;
  __s = lrq->orig_size;
  local_230.first.field_2._M_allocated_capacity = (size_type)base;
  memset(__s,0,0x800);
  pbVar6 = (ec->super_example_predict).indices._end;
  for (pbVar12 = (ec->super_example_predict).indices._begin; pbVar12 != pbVar6;
      pbVar12 = (byte *)((long)pbVar12 + 1)) {
    bVar2 = *pbVar12;
    if (lrq->lrindices[bVar2] == true) {
      __s[bVar2] = (long)(ec->super_example_predict).feature_space[bVar2].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2;
    }
  }
  fVar1 = (ec->l).simple.label;
  bVar3 = lrq->dropout;
  fVar22 = 1.0;
  local_294 = 1.0;
  if (bVar3 != false) {
    fVar22 = 0.5;
  }
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    local_294 = fVar22;
  }
  local_288 = ec->example_counter;
  uVar18 = &(lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  puVar17 = &(pvVar5->weights).dense_weights._stride_shift;
  if ((pvVar5->weights).sparse != false) {
    puVar17 = &(pvVar5->weights).sparse_weights._stride_shift;
  }
  local_1f0 = &lrq->seed;
  local_1e8 = (ulong)*puVar17;
  local_2a0 = 0.0;
  local_2a4 = 0.0;
  local_2a8 = 0.0;
  local_230.first.field_2._8_8_ = uVar18;
  iVar10 = 0;
  while( true ) {
    p_Var16 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var16 != (_Rb_tree_node_base *)uVar18) {
      local_230.second._M_string_length = (size_type)((uint)local_288 & 1);
      local_230.second._M_dataplus._M_p = (pointer)(local_230.second._M_string_length ^ 1);
      do {
        lVar7 = *(long *)(p_Var16 + 1);
        bVar2 = *(byte *)(lVar7 + local_230.second._M_string_length);
        bVar4 = local_230.second._M_dataplus._M_p[lVar7];
        local_230.second.field_2._M_allocated_capacity = (size_type)p_Var16;
        uVar11 = atoi((char *)(lVar7 + 2));
        if (__s[bVar2] != 0) {
          local_230.second.field_2._8_8_ = (ec->super_example_predict).feature_space + bVar2;
          this = (ec->super_example_predict).feature_space + bVar4;
          this_00 = &(ec->super_example_predict).feature_space[bVar4].space_names;
          local_278 = 0;
          do {
            if (uVar11 != 0) {
              local_1e0 = (ec->super_example_predict).ft_offset +
                          ((v_array<unsigned_long> *)(local_230.second.field_2._8_8_ + 0x20))->
                          _begin[local_278];
              fVar22 = *(float *)(*(long *)local_230.second.field_2._8_8_ + local_278 * 4);
              local_2b4 = 1;
              do {
                if ((bVar3 != true || fVar1 == 3.4028235e+38) ||
                   (fVar23 = merand48(local_1f0), 0.5 < fVar23)) {
                  local_1d8 = (ulong)local_2b4;
                  local_1d0 = local_1d8 << ((byte)local_1e8 & 0x3f);
                  i = local_1e0 + local_1d0;
                  pvVar8 = lrq->all;
                  if ((pvVar8->weights).sparse == true) {
                    pwVar13 = sparse_parameters::operator[](&(pvVar8->weights).sparse_weights,i);
                  }
                  else {
                    pwVar13 = (pvVar8->weights).dense_weights._begin +
                              ((pvVar8->weights).dense_weights._weight_mask & i);
                  }
                  fVar23 = (ec->l).simple.label;
                  if ((((fVar23 != 3.4028235e+38) || (NAN(fVar23))) && (*pwVar13 == 0.0)) &&
                     (!NAN(*pwVar13))) {
                    local_1b8[0] = i;
                    fVar23 = merand48(local_1b8);
                    *pwVar13 = fVar23;
                  }
                  if (__s[bVar4] != 0) {
                    uVar19 = 0;
                    uVar20 = 1;
                    do {
                      features::push_back(this,*pwVar13 * local_294 * fVar22 *
                                               (this->values)._begin[uVar19],
                                          (this->indicies)._begin[uVar19] + local_1d0);
                      if ((pvVar5->audit != false) || (pvVar5->hash_inv == true)) {
                        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                        local_240.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = bVar4;
                        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,(char *)&local_240,1);
                        local_240.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = 0x5e;
                        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,(char *)&local_240,1);
                        peVar9 = this_00->_begin[uVar19].
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,(peVar9->second)._M_dataplus._M_p,
                                             (peVar9->second)._M_string_length);
                        local_240.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)
                                  CONCAT71(local_240.
                                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr._1_7_,0x5e);
                        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,(char *)&local_240,1);
                        std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                        local_1c0 = strdup("lrq");
                        std::__cxx11::stringbuf::str();
                        peVar9 = local_240.
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        pcVar15 = strdup((char *)local_240.
                                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr);
                        if (peVar9 != &local_230) {
                          operator_delete(peVar9);
                        }
                        local_1c8 = pcVar15;
                        this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)operator_new(0x40);
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<char_*&,_char_*&,_true>(this_01,&local_1c0,&local_1c8);
                        local_240.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = this_01;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                                  (&local_240.
                                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,this_01);
                        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::push_back(this_00,&local_240);
                        if (local_240.
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_240.
                                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                      }
                      bVar21 = uVar20 < __s[bVar4];
                      uVar19 = uVar20;
                      uVar20 = (ulong)((int)uVar20 + 1);
                    } while (bVar21);
                  }
                }
                local_2b4 = local_2b4 + 1;
              } while (local_2b4 <= uVar11);
            }
            local_278 = (ulong)((int)local_278 + 1);
          } while (local_278 < __s[bVar2]);
        }
        p_Var16 = (_Rb_tree_node_base *)
                  std::_Rb_tree_increment
                            ((_Rb_tree_node_base *)local_230.second.field_2._M_allocated_capacity);
        uVar18 = local_230.first.field_2._8_8_;
      } while (p_Var16 != (_Rb_tree_node_base *)local_230.first.field_2._8_8_);
    }
    (**(code **)(local_230.first.field_2._M_allocated_capacity + 0x28))
              (*(undefined8 *)(local_230.first.field_2._M_allocated_capacity + 0x18),
               *(undefined8 *)(local_230.first.field_2._M_allocated_capacity + 0x20),ec);
    if (iVar10 == 0) {
      local_2a0 = (ec->pred).scalar;
      local_2a4 = ec->loss;
      local_2a8 = ec->confidence;
    }
    else {
      (ec->pred).scalar = local_2a0;
      ec->loss = local_2a4;
      ec->confidence = local_2a8;
    }
    p_Var16 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var16 != (_Rb_tree_node_base *)uVar18) {
      do {
        bVar2 = *(byte *)(*(long *)(p_Var16 + 1) + (ulong)(~(uint)local_288 & 1));
        features::truncate_to((ec->super_example_predict).feature_space + bVar2,__s[bVar2]);
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Rb_tree_node_base *)uVar18);
    }
    if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) break;
    local_288 = local_288 + 1;
    bVar21 = iVar10 != 0;
    iVar10 = iVar10 + 1;
    if (bVar21) {
      return;
    }
  }
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}